

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20_Vec256.c
# Opt level: O3

void chacha20_core_256(Lib_IntVector_Intrinsics_vec256 *k,Lib_IntVector_Intrinsics_vec256 *ctx,
                      uint32_t ctr)

{
  Lib_IntVector_Intrinsics_vec256 alVar1;
  Lib_IntVector_Intrinsics_vec256 alVar2;
  Lib_IntVector_Intrinsics_vec256 alVar3;
  Lib_IntVector_Intrinsics_vec256 alVar4;
  Lib_IntVector_Intrinsics_vec256 alVar5;
  Lib_IntVector_Intrinsics_vec256 alVar6;
  Lib_IntVector_Intrinsics_vec256 alVar7;
  Lib_IntVector_Intrinsics_vec256 alVar8;
  Lib_IntVector_Intrinsics_vec256 alVar9;
  Lib_IntVector_Intrinsics_vec256 alVar10;
  Lib_IntVector_Intrinsics_vec256 alVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  Lib_IntVector_Intrinsics_vec256 alVar15;
  Lib_IntVector_Intrinsics_vec256 alVar16;
  Lib_IntVector_Intrinsics_vec256 alVar17;
  Lib_IntVector_Intrinsics_vec256 *os;
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  
  memcpy(k,ctx,0x200);
  iVar18 = ctr << 3;
  auVar19._4_4_ = iVar18;
  auVar19._0_4_ = iVar18;
  auVar19._8_4_ = iVar18;
  auVar19._12_4_ = iVar18;
  auVar19._16_4_ = iVar18;
  auVar19._20_4_ = iVar18;
  auVar19._24_4_ = iVar18;
  auVar19._28_4_ = iVar18;
  auVar24 = vpaddd_avx2(auVar19,(undefined1  [32])k[0xc]);
  auVar23 = vpaddd_avx2((undefined1  [32])k[4],(undefined1  [32])*k);
  auVar24 = vpshuflw_avx2(auVar23 ^ auVar24,0xb1);
  auVar33 = vpshufhw_avx2(auVar24,0xb1);
  auVar24 = vpaddd_avx2(auVar33,(undefined1  [32])k[8]);
  auVar21 = auVar24 ^ (undefined1  [32])k[4];
  auVar30 = vpsrld_avx2(auVar21,0x14);
  auVar21 = vpslld_avx2(auVar21,0xc);
  auVar21 = vpor_avx2(auVar21,auVar30);
  auVar23 = vpaddd_avx2(auVar21,auVar23);
  auVar22._16_16_ = _DAT_001dc980;
  auVar22._0_16_ = _DAT_001dc980;
  auVar12 = vpshufb_avx2(auVar23,auVar22);
  auVar31 = vpshufb_avx2(auVar33,auVar22);
  auVar24 = vpaddd_avx2(auVar31 ^ auVar12,auVar24);
  auVar28 = vpsrld_avx2(auVar21 ^ auVar24,0x19);
  auVar30 = vpslld_avx2(auVar21 ^ auVar24,7);
  auVar21 = vpaddd_avx2((undefined1  [32])k[5],(undefined1  [32])k[1]);
  auVar33 = vpshuflw_avx2(auVar21 ^ (undefined1  [32])k[0xd],0xb1);
  auVar25 = vpshufhw_avx2(auVar33,0xb1);
  auVar33 = vpaddd_avx2(auVar25,(undefined1  [32])k[9]);
  auVar35 = vpor_avx2(auVar30,auVar28);
  auVar30 = auVar33 ^ (undefined1  [32])k[5];
  auVar28 = vpsrld_avx2(auVar30,0x14);
  auVar30 = vpslld_avx2(auVar30,0xc);
  auVar30 = vpor_avx2(auVar30,auVar28);
  auVar21 = vpaddd_avx2(auVar21,auVar30);
  auVar13 = vpshufb_avx2(auVar21,auVar22);
  auVar37 = vpshufb_avx2(auVar25,auVar22);
  auVar33 = vpaddd_avx2(auVar33,auVar37 ^ auVar13);
  auVar25 = vpsrld_avx2(auVar33 ^ auVar30,0x19);
  auVar30 = vpslld_avx2(auVar33 ^ auVar30,7);
  auVar26 = vpor_avx2(auVar30,auVar25);
  auVar30 = vpaddd_avx2((undefined1  [32])k[6],(undefined1  [32])k[2]);
  auVar25 = vpshuflw_avx2(auVar30 ^ (undefined1  [32])k[0xe],0xb1);
  auVar20 = vpshufhw_avx2(auVar25,0xb1);
  auVar25 = vpaddd_avx2(auVar20,(undefined1  [32])k[10]);
  auVar28 = auVar25 ^ (undefined1  [32])k[6];
  auVar32 = vpsrld_avx2(auVar28,0x14);
  auVar28 = vpslld_avx2(auVar28,0xc);
  auVar28 = vpor_avx2(auVar32,auVar28);
  auVar30 = vpaddd_avx2(auVar28,auVar30);
  auVar14 = vpshufb_avx2(auVar30,auVar22);
  auVar38 = vpshufb_avx2(auVar20,auVar22);
  auVar25 = vpaddd_avx2(auVar25,auVar38 ^ auVar14);
  auVar32 = vpsrld_avx2(auVar25 ^ auVar28,0x19);
  auVar20 = vpslld_avx2(auVar25 ^ auVar28,7);
  auVar28 = vpaddd_avx2((undefined1  [32])k[7],(undefined1  [32])k[3]);
  auVar32 = vpor_avx2(auVar32,auVar20);
  auVar20 = vpshuflw_avx2(auVar28 ^ (undefined1  [32])k[0xf],0xb1);
  auVar27 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2(auVar27,(undefined1  [32])k[0xb]);
  auVar29 = auVar20 ^ (undefined1  [32])k[7];
  auVar34 = vpsrld_avx2(auVar29,0x14);
  auVar29 = vpslld_avx2(auVar29,0xc);
  auVar29 = vpor_avx2(auVar34,auVar29);
  auVar28 = vpaddd_avx2(auVar28,auVar29);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar28,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar34 ^ auVar27);
  auVar36 = vpsrld_avx2(auVar20 ^ auVar29,0x19);
  auVar29 = vpslld_avx2(auVar20 ^ auVar29,7);
  auVar29 = vpor_avx2(auVar36,auVar29);
  auVar23 = vpaddd_avx2(auVar23,auVar26);
  auVar27 = vpshuflw_avx2(auVar34 ^ auVar27 ^ auVar23,0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar25 = vpaddd_avx2(auVar25,auVar27);
  auVar34 = vpsrld_avx2(auVar25 ^ auVar26,0x14);
  auVar26 = vpslld_avx2(auVar25 ^ auVar26,0xc);
  auVar26 = vpor_avx2(auVar34,auVar26);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar23,auVar22);
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar27 ^ auVar34);
  auVar25 = vpaddd_avx2(auVar25,auVar27 ^ auVar34);
  auVar27 = vpsrld_avx2(auVar25 ^ auVar26,0x19);
  auVar26 = vpslld_avx2(auVar25 ^ auVar26,7);
  auVar26 = vpor_avx2(auVar26,auVar27);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshuflw_avx2(auVar31 ^ auVar12 ^ auVar21,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar20 = vpaddd_avx2(auVar20,auVar12);
  auVar31 = vpsrld_avx2(auVar20 ^ auVar32,0x14);
  auVar32 = vpslld_avx2(auVar20 ^ auVar32,0xc);
  auVar32 = vpor_avx2(auVar32,auVar31);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar21,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar20 ^ auVar32,0x19);
  auVar32 = vpslld_avx2(auVar20 ^ auVar32,7);
  auVar32 = vpor_avx2(auVar32,auVar27);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshuflw_avx2(auVar37 ^ auVar13 ^ auVar30,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar24 = vpaddd_avx2(auVar13,auVar24);
  auVar37 = vpsrld_avx2(auVar24 ^ auVar29,0x14);
  auVar29 = vpslld_avx2(auVar24 ^ auVar29,0xc);
  auVar29 = vpor_avx2(auVar29,auVar37);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar30,auVar22);
  auVar24 = vpaddd_avx2(auVar24,auVar13 ^ auVar37);
  auVar27 = vpsrld_avx2(auVar29 ^ auVar24,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar24,7);
  auVar29 = vpor_avx2(auVar27,auVar29);
  auVar28 = vpaddd_avx2(auVar28,auVar35);
  auVar14 = vpshuflw_avx2(auVar38 ^ auVar14 ^ auVar28,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar14);
  auVar38 = vpsrld_avx2(auVar33 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar38);
  auVar28 = vpaddd_avx2(auVar35,auVar28);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar28,auVar22);
  auVar33 = vpaddd_avx2(auVar33,auVar14 ^ auVar38);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar23 = vpaddd_avx2(auVar23,auVar35);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar23,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar24 = vpaddd_avx2(auVar24,auVar12);
  auVar31 = vpsrld_avx2(auVar24 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar31);
  auVar23 = vpaddd_avx2(auVar35,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar23,auVar22);
  auVar24 = vpaddd_avx2(auVar24,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar24 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar13 = vpshuflw_avx2(auVar13 ^ auVar37 ^ auVar21,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar13);
  auVar37 = vpsrld_avx2(auVar26 ^ auVar33,0x14);
  auVar26 = vpslld_avx2(auVar26 ^ auVar33,0xc);
  auVar26 = vpor_avx2(auVar26,auVar37);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar21,auVar22);
  auVar33 = vpaddd_avx2(auVar13 ^ auVar37,auVar33);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar26,0x19);
  auVar26 = vpslld_avx2(auVar33 ^ auVar26,7);
  auVar26 = vpor_avx2(auVar26,auVar27);
  auVar30 = vpaddd_avx2(auVar30,auVar32);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar30,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar25 = vpaddd_avx2(auVar14,auVar25);
  auVar38 = vpsrld_avx2(auVar25 ^ auVar32,0x14);
  auVar32 = vpslld_avx2(auVar25 ^ auVar32,0xc);
  auVar32 = vpor_avx2(auVar32,auVar38);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar30,auVar22);
  auVar25 = vpaddd_avx2(auVar14 ^ auVar38,auVar25);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar25,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar25,7);
  auVar32 = vpor_avx2(auVar32,auVar27);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshuflw_avx2(auVar28 ^ (undefined1  [32])k[0xf],0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar20 = vpaddd_avx2(auVar27,auVar20);
  auVar34 = vpsrld_avx2(auVar29 ^ auVar20,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,0xc);
  auVar29 = vpor_avx2(auVar29,auVar34);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar28,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar27 ^ auVar34);
  auVar36 = vpsrld_avx2(auVar29 ^ auVar20,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,7);
  auVar29 = vpor_avx2(auVar36,auVar29);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshuflw_avx2(auVar27 ^ auVar34 ^ auVar23,0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar25 = vpaddd_avx2(auVar25,auVar27);
  auVar34 = vpsrld_avx2(auVar25 ^ auVar26,0x14);
  auVar26 = vpslld_avx2(auVar25 ^ auVar26,0xc);
  auVar26 = vpor_avx2(auVar34,auVar26);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar23,auVar22);
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar27 ^ auVar34);
  auVar25 = vpaddd_avx2(auVar25,auVar27 ^ auVar34);
  auVar27 = vpsrld_avx2(auVar25 ^ auVar26,0x19);
  auVar26 = vpslld_avx2(auVar25 ^ auVar26,7);
  auVar26 = vpor_avx2(auVar26,auVar27);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshuflw_avx2(auVar21 ^ auVar12 ^ auVar31,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar20 = vpaddd_avx2(auVar20,auVar12);
  auVar31 = vpsrld_avx2(auVar20 ^ auVar32,0x14);
  auVar32 = vpslld_avx2(auVar20 ^ auVar32,0xc);
  auVar32 = vpor_avx2(auVar32,auVar31);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar21,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar20 ^ auVar32,0x19);
  auVar32 = vpslld_avx2(auVar20 ^ auVar32,7);
  auVar32 = vpor_avx2(auVar32,auVar27);
  auVar30 = vpaddd_avx2(auVar30,auVar29);
  auVar13 = vpshuflw_avx2(auVar13 ^ auVar37 ^ auVar30,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar24 = vpaddd_avx2(auVar13,auVar24);
  auVar37 = vpsrld_avx2(auVar24 ^ auVar29,0x14);
  auVar29 = vpslld_avx2(auVar24 ^ auVar29,0xc);
  auVar29 = vpor_avx2(auVar29,auVar37);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar30,auVar22);
  auVar24 = vpaddd_avx2(auVar24,auVar13 ^ auVar37);
  auVar27 = vpsrld_avx2(auVar24 ^ auVar29,0x19);
  auVar29 = vpslld_avx2(auVar24 ^ auVar29,7);
  auVar29 = vpor_avx2(auVar29,auVar27);
  auVar28 = vpaddd_avx2(auVar28,auVar35);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar28,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar33 = vpaddd_avx2(auVar14,auVar33);
  auVar38 = vpsrld_avx2(auVar33 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar38);
  auVar28 = vpaddd_avx2(auVar35,auVar28);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar28,auVar22);
  auVar33 = vpaddd_avx2(auVar33,auVar38 ^ auVar14);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar27,auVar35);
  auVar23 = vpaddd_avx2(auVar23,auVar35);
  auVar12 = vpshuflw_avx2(auVar23 ^ auVar12 ^ auVar31,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar24 = vpaddd_avx2(auVar24,auVar12);
  auVar31 = vpsrld_avx2(auVar24 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar31,auVar35);
  auVar23 = vpaddd_avx2(auVar35,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar23,auVar22);
  auVar24 = vpaddd_avx2(auVar24,auVar31 ^ auVar12);
  auVar27 = vpsrld_avx2(auVar35 ^ auVar24,0x19);
  auVar35 = vpslld_avx2(auVar35 ^ auVar24,7);
  auVar35 = vpor_avx2(auVar27,auVar35);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar13 = vpshuflw_avx2(auVar13 ^ auVar37 ^ auVar21,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar13);
  auVar37 = vpsrld_avx2(auVar26 ^ auVar33,0x14);
  auVar26 = vpslld_avx2(auVar26 ^ auVar33,0xc);
  auVar26 = vpor_avx2(auVar26,auVar37);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar21,auVar22);
  auVar33 = vpaddd_avx2(auVar13 ^ auVar37,auVar33);
  auVar27 = vpsrld_avx2(auVar26 ^ auVar33,0x19);
  auVar26 = vpslld_avx2(auVar26 ^ auVar33,7);
  auVar26 = vpor_avx2(auVar26,auVar27);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshuflw_avx2(auVar38 ^ auVar14 ^ auVar30,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar25 = vpaddd_avx2(auVar14,auVar25);
  auVar38 = vpsrld_avx2(auVar32 ^ auVar25,0x14);
  auVar32 = vpslld_avx2(auVar32 ^ auVar25,0xc);
  auVar32 = vpor_avx2(auVar32,auVar38);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar30,auVar22);
  auVar25 = vpaddd_avx2(auVar14 ^ auVar38,auVar25);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar25,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar25,7);
  auVar32 = vpor_avx2(auVar32,auVar27);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshuflw_avx2(auVar28 ^ (undefined1  [32])k[0xf],0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar20 = vpaddd_avx2(auVar20,auVar27);
  auVar34 = vpsrld_avx2(auVar29 ^ auVar20,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,0xc);
  auVar29 = vpor_avx2(auVar29,auVar34);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar28,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar27 ^ auVar34);
  auVar36 = vpsrld_avx2(auVar29 ^ auVar20,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,7);
  auVar29 = vpor_avx2(auVar36,auVar29);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshuflw_avx2(auVar27 ^ auVar34 ^ auVar23,0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar25 = vpaddd_avx2(auVar25,auVar27);
  auVar34 = vpsrld_avx2(auVar25 ^ auVar26,0x14);
  auVar26 = vpslld_avx2(auVar25 ^ auVar26,0xc);
  auVar26 = vpor_avx2(auVar34,auVar26);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar23,auVar22);
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar27 ^ auVar34);
  auVar25 = vpaddd_avx2(auVar25,auVar27 ^ auVar34);
  auVar27 = vpsrld_avx2(auVar26 ^ auVar25,0x19);
  auVar26 = vpslld_avx2(auVar26 ^ auVar25,7);
  auVar26 = vpor_avx2(auVar26,auVar27);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshuflw_avx2(auVar21 ^ auVar31 ^ auVar12,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar20 = vpaddd_avx2(auVar20,auVar12);
  auVar31 = vpsrld_avx2(auVar20 ^ auVar32,0x14);
  auVar32 = vpslld_avx2(auVar20 ^ auVar32,0xc);
  auVar32 = vpor_avx2(auVar32,auVar31);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar21,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar20,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar20,7);
  auVar32 = vpor_avx2(auVar32,auVar27);
  auVar30 = vpaddd_avx2(auVar30,auVar29);
  auVar13 = vpshuflw_avx2(auVar13 ^ auVar37 ^ auVar30,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar24 = vpaddd_avx2(auVar13,auVar24);
  auVar37 = vpsrld_avx2(auVar24 ^ auVar29,0x14);
  auVar29 = vpslld_avx2(auVar24 ^ auVar29,0xc);
  auVar29 = vpor_avx2(auVar37,auVar29);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar30,auVar22);
  auVar24 = vpaddd_avx2(auVar24,auVar13 ^ auVar37);
  auVar27 = vpsrld_avx2(auVar24 ^ auVar29,0x19);
  auVar29 = vpslld_avx2(auVar24 ^ auVar29,7);
  auVar29 = vpor_avx2(auVar29,auVar27);
  auVar28 = vpaddd_avx2(auVar28,auVar35);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar28,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar33 = vpaddd_avx2(auVar14,auVar33);
  auVar38 = vpsrld_avx2(auVar33 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar38);
  auVar28 = vpaddd_avx2(auVar35,auVar28);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar28,auVar22);
  auVar33 = vpaddd_avx2(auVar33,auVar14 ^ auVar38);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar23 = vpaddd_avx2(auVar35,auVar23);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar23,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar24 = vpaddd_avx2(auVar24,auVar12);
  auVar31 = vpsrld_avx2(auVar24 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar31,auVar35);
  auVar23 = vpaddd_avx2(auVar35,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar23,auVar22);
  auVar24 = vpaddd_avx2(auVar24,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar24 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar13 = vpshuflw_avx2(auVar13 ^ auVar37 ^ auVar21,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar13);
  auVar37 = vpsrld_avx2(auVar26 ^ auVar33,0x14);
  auVar26 = vpslld_avx2(auVar26 ^ auVar33,0xc);
  auVar26 = vpor_avx2(auVar26,auVar37);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar21,auVar22);
  auVar33 = vpaddd_avx2(auVar37 ^ auVar13,auVar33);
  auVar27 = vpsrld_avx2(auVar26 ^ auVar33,0x19);
  auVar26 = vpslld_avx2(auVar26 ^ auVar33,7);
  auVar26 = vpor_avx2(auVar27,auVar26);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar30,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar25 = vpaddd_avx2(auVar14,auVar25);
  auVar38 = vpsrld_avx2(auVar32 ^ auVar25,0x14);
  auVar32 = vpslld_avx2(auVar32 ^ auVar25,0xc);
  auVar32 = vpor_avx2(auVar32,auVar38);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar30,auVar22);
  auVar25 = vpaddd_avx2(auVar38 ^ auVar14,auVar25);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar25,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar25,7);
  auVar32 = vpor_avx2(auVar27,auVar32);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshuflw_avx2(auVar28 ^ (undefined1  [32])k[0xf],0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar20 = vpaddd_avx2(auVar20,auVar27);
  auVar34 = vpsrld_avx2(auVar29 ^ auVar20,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,0xc);
  auVar29 = vpor_avx2(auVar29,auVar34);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar28,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar27 ^ auVar34);
  auVar36 = vpsrld_avx2(auVar29 ^ auVar20,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,7);
  auVar29 = vpor_avx2(auVar36,auVar29);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshuflw_avx2(auVar27 ^ auVar34 ^ auVar23,0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar25 = vpaddd_avx2(auVar25,auVar27);
  auVar34 = vpsrld_avx2(auVar26 ^ auVar25,0x14);
  auVar26 = vpslld_avx2(auVar26 ^ auVar25,0xc);
  auVar26 = vpor_avx2(auVar26,auVar34);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar23,auVar22);
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar27 ^ auVar34);
  auVar25 = vpaddd_avx2(auVar25,auVar27 ^ auVar34);
  auVar27 = vpsrld_avx2(auVar26 ^ auVar25,0x19);
  auVar26 = vpslld_avx2(auVar26 ^ auVar25,7);
  auVar26 = vpor_avx2(auVar26,auVar27);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar21,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar20 = vpaddd_avx2(auVar20,auVar12);
  auVar31 = vpsrld_avx2(auVar32 ^ auVar20,0x14);
  auVar32 = vpslld_avx2(auVar32 ^ auVar20,0xc);
  auVar32 = vpor_avx2(auVar32,auVar31);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar21,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar20,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar20,7);
  auVar32 = vpor_avx2(auVar32,auVar27);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshuflw_avx2(auVar37 ^ auVar13 ^ auVar30,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar24 = vpaddd_avx2(auVar13,auVar24);
  auVar37 = vpsrld_avx2(auVar29 ^ auVar24,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar24,0xc);
  auVar29 = vpor_avx2(auVar29,auVar37);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar30,auVar22);
  auVar24 = vpaddd_avx2(auVar13 ^ auVar37,auVar24);
  auVar27 = vpsrld_avx2(auVar29 ^ auVar24,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar24,7);
  auVar29 = vpor_avx2(auVar29,auVar27);
  auVar28 = vpaddd_avx2(auVar28,auVar35);
  auVar14 = vpshuflw_avx2(auVar38 ^ auVar14 ^ auVar28,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar14);
  auVar38 = vpsrld_avx2(auVar33 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar38);
  auVar28 = vpaddd_avx2(auVar35,auVar28);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar28,auVar22);
  auVar33 = vpaddd_avx2(auVar14 ^ auVar38,auVar33);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar23 = vpaddd_avx2(auVar23,auVar35);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar23,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar24 = vpaddd_avx2(auVar24,auVar12);
  auVar31 = vpsrld_avx2(auVar24 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar31);
  auVar23 = vpaddd_avx2(auVar35,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar23,auVar22);
  auVar24 = vpaddd_avx2(auVar24,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar24 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar13 = vpshuflw_avx2(auVar13 ^ auVar37 ^ auVar21,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar13);
  auVar37 = vpsrld_avx2(auVar26 ^ auVar33,0x14);
  auVar26 = vpslld_avx2(auVar26 ^ auVar33,0xc);
  auVar26 = vpor_avx2(auVar37,auVar26);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar21,auVar22);
  auVar33 = vpaddd_avx2(auVar37 ^ auVar13,auVar33);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar26,0x19);
  auVar26 = vpslld_avx2(auVar33 ^ auVar26,7);
  auVar26 = vpor_avx2(auVar26,auVar27);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar30,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar25 = vpaddd_avx2(auVar14,auVar25);
  auVar38 = vpsrld_avx2(auVar25 ^ auVar32,0x14);
  auVar32 = vpslld_avx2(auVar25 ^ auVar32,0xc);
  auVar32 = vpor_avx2(auVar32,auVar38);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar30,auVar22);
  auVar25 = vpaddd_avx2(auVar25,auVar14 ^ auVar38);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar25,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar25,7);
  auVar32 = vpor_avx2(auVar32,auVar27);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshuflw_avx2(auVar28 ^ (undefined1  [32])k[0xf],0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar20 = vpaddd_avx2(auVar27,auVar20);
  auVar34 = vpsrld_avx2(auVar29 ^ auVar20,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,0xc);
  auVar29 = vpor_avx2(auVar29,auVar34);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar28,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar34 ^ auVar27);
  auVar36 = vpsrld_avx2(auVar29 ^ auVar20,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,7);
  auVar29 = vpor_avx2(auVar29,auVar36);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshuflw_avx2(auVar23 ^ auVar34 ^ auVar27,0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar25 = vpaddd_avx2(auVar25,auVar27);
  auVar34 = vpsrld_avx2(auVar26 ^ auVar25,0x14);
  auVar26 = vpslld_avx2(auVar26 ^ auVar25,0xc);
  auVar26 = vpor_avx2(auVar26,auVar34);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar23,auVar22);
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar34 ^ auVar27);
  auVar25 = vpaddd_avx2(auVar25,auVar34 ^ auVar27);
  auVar27 = vpsrld_avx2(auVar26 ^ auVar25,0x19);
  auVar26 = vpslld_avx2(auVar26 ^ auVar25,7);
  auVar26 = vpor_avx2(auVar27,auVar26);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar21,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar20 = vpaddd_avx2(auVar20,auVar12);
  auVar31 = vpsrld_avx2(auVar32 ^ auVar20,0x14);
  auVar32 = vpslld_avx2(auVar32 ^ auVar20,0xc);
  auVar32 = vpor_avx2(auVar31,auVar32);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar21,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar20,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar20,7);
  auVar32 = vpor_avx2(auVar27,auVar32);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshuflw_avx2(auVar37 ^ auVar13 ^ auVar30,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar24 = vpaddd_avx2(auVar13,auVar24);
  auVar37 = vpsrld_avx2(auVar29 ^ auVar24,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar24,0xc);
  auVar29 = vpor_avx2(auVar29,auVar37);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar30,auVar22);
  auVar24 = vpaddd_avx2(auVar37 ^ auVar13,auVar24);
  auVar27 = vpsrld_avx2(auVar29 ^ auVar24,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar24,7);
  auVar29 = vpor_avx2(auVar27,auVar29);
  auVar28 = vpaddd_avx2(auVar28,auVar35);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar28,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar14);
  auVar38 = vpsrld_avx2(auVar33 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar38);
  auVar28 = vpaddd_avx2(auVar35,auVar28);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar28,auVar22);
  auVar33 = vpaddd_avx2(auVar14 ^ auVar38,auVar33);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar23 = vpaddd_avx2(auVar23,auVar35);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar23,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar24 = vpaddd_avx2(auVar24,auVar12);
  auVar31 = vpsrld_avx2(auVar24 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar31);
  auVar23 = vpaddd_avx2(auVar35,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar23,auVar22);
  auVar24 = vpaddd_avx2(auVar24,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar24 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar21 = vpaddd_avx2(auVar21,auVar26);
  auVar13 = vpshuflw_avx2(auVar37 ^ auVar13 ^ auVar21,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar13);
  auVar37 = vpsrld_avx2(auVar33 ^ auVar26,0x14);
  auVar26 = vpslld_avx2(auVar33 ^ auVar26,0xc);
  auVar26 = vpor_avx2(auVar37,auVar26);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar21,auVar22);
  auVar33 = vpaddd_avx2(auVar37 ^ auVar13,auVar33);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar26,0x19);
  auVar26 = vpslld_avx2(auVar33 ^ auVar26,7);
  auVar26 = vpor_avx2(auVar26,auVar27);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar30,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar25 = vpaddd_avx2(auVar14,auVar25);
  auVar38 = vpsrld_avx2(auVar25 ^ auVar32,0x14);
  auVar32 = vpslld_avx2(auVar25 ^ auVar32,0xc);
  auVar32 = vpor_avx2(auVar32,auVar38);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar30,auVar22);
  auVar25 = vpaddd_avx2(auVar25,auVar14 ^ auVar38);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar25,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar25,7);
  auVar32 = vpor_avx2(auVar32,auVar27);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshuflw_avx2(auVar28 ^ (undefined1  [32])k[0xf],0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar20 = vpaddd_avx2(auVar27,auVar20);
  auVar34 = vpsrld_avx2(auVar29 ^ auVar20,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,0xc);
  auVar29 = vpor_avx2(auVar29,auVar34);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar28,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar34 ^ auVar27);
  auVar36 = vpsrld_avx2(auVar29 ^ auVar20,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,7);
  auVar29 = vpor_avx2(auVar29,auVar36);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshuflw_avx2(auVar23 ^ auVar34 ^ auVar27,0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar25 = vpaddd_avx2(auVar25,auVar27);
  auVar34 = vpsrld_avx2(auVar26 ^ auVar25,0x14);
  auVar26 = vpslld_avx2(auVar26 ^ auVar25,0xc);
  auVar26 = vpor_avx2(auVar26,auVar34);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar23,auVar22);
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar34 ^ auVar27);
  auVar25 = vpaddd_avx2(auVar25,auVar34 ^ auVar27);
  auVar27 = vpsrld_avx2(auVar26 ^ auVar25,0x19);
  auVar26 = vpslld_avx2(auVar26 ^ auVar25,7);
  auVar26 = vpor_avx2(auVar27,auVar26);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar21,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar20 = vpaddd_avx2(auVar20,auVar12);
  auVar31 = vpsrld_avx2(auVar32 ^ auVar20,0x14);
  auVar32 = vpslld_avx2(auVar32 ^ auVar20,0xc);
  auVar32 = vpor_avx2(auVar31,auVar32);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar21,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar20,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar20,7);
  auVar32 = vpor_avx2(auVar27,auVar32);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshuflw_avx2(auVar37 ^ auVar13 ^ auVar30,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar24 = vpaddd_avx2(auVar13,auVar24);
  auVar37 = vpsrld_avx2(auVar29 ^ auVar24,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar24,0xc);
  auVar29 = vpor_avx2(auVar29,auVar37);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar30,auVar22);
  auVar24 = vpaddd_avx2(auVar37 ^ auVar13,auVar24);
  auVar27 = vpsrld_avx2(auVar29 ^ auVar24,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar24,7);
  auVar29 = vpor_avx2(auVar27,auVar29);
  auVar28 = vpaddd_avx2(auVar28,auVar35);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar28,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar14);
  auVar38 = vpsrld_avx2(auVar33 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar38);
  auVar28 = vpaddd_avx2(auVar35,auVar28);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar28,auVar22);
  auVar33 = vpaddd_avx2(auVar14 ^ auVar38,auVar33);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar23 = vpaddd_avx2(auVar23,auVar35);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar23,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar24 = vpaddd_avx2(auVar24,auVar12);
  auVar31 = vpsrld_avx2(auVar24 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar31);
  auVar23 = vpaddd_avx2(auVar35,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar23,auVar22);
  auVar24 = vpaddd_avx2(auVar24,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar24 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar21 = vpaddd_avx2(auVar21,auVar26);
  auVar13 = vpshuflw_avx2(auVar37 ^ auVar13 ^ auVar21,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar13);
  auVar37 = vpsrld_avx2(auVar33 ^ auVar26,0x14);
  auVar26 = vpslld_avx2(auVar33 ^ auVar26,0xc);
  auVar26 = vpor_avx2(auVar37,auVar26);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar21,auVar22);
  auVar33 = vpaddd_avx2(auVar37 ^ auVar13,auVar33);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar26,0x19);
  auVar26 = vpslld_avx2(auVar33 ^ auVar26,7);
  auVar26 = vpor_avx2(auVar26,auVar27);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar30,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar25 = vpaddd_avx2(auVar14,auVar25);
  auVar38 = vpsrld_avx2(auVar25 ^ auVar32,0x14);
  auVar32 = vpslld_avx2(auVar25 ^ auVar32,0xc);
  auVar32 = vpor_avx2(auVar32,auVar38);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar30,auVar22);
  auVar25 = vpaddd_avx2(auVar25,auVar14 ^ auVar38);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar25,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar25,7);
  auVar32 = vpor_avx2(auVar32,auVar27);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshuflw_avx2(auVar28 ^ (undefined1  [32])k[0xf],0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar20 = vpaddd_avx2(auVar27,auVar20);
  auVar34 = vpsrld_avx2(auVar29 ^ auVar20,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,0xc);
  auVar29 = vpor_avx2(auVar29,auVar34);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar28,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar34 ^ auVar27);
  auVar36 = vpsrld_avx2(auVar29 ^ auVar20,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,7);
  auVar29 = vpor_avx2(auVar29,auVar36);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshuflw_avx2(auVar23 ^ auVar34 ^ auVar27,0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar25 = vpaddd_avx2(auVar25,auVar27);
  auVar34 = vpsrld_avx2(auVar26 ^ auVar25,0x14);
  auVar26 = vpslld_avx2(auVar26 ^ auVar25,0xc);
  auVar26 = vpor_avx2(auVar26,auVar34);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar23,auVar22);
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar34 ^ auVar27);
  auVar25 = vpaddd_avx2(auVar25,auVar34 ^ auVar27);
  auVar27 = vpsrld_avx2(auVar26 ^ auVar25,0x19);
  auVar26 = vpslld_avx2(auVar26 ^ auVar25,7);
  auVar26 = vpor_avx2(auVar27,auVar26);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar21,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar20 = vpaddd_avx2(auVar20,auVar12);
  auVar31 = vpsrld_avx2(auVar32 ^ auVar20,0x14);
  auVar32 = vpslld_avx2(auVar32 ^ auVar20,0xc);
  auVar32 = vpor_avx2(auVar31,auVar32);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar21,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar20,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar20,7);
  auVar32 = vpor_avx2(auVar27,auVar32);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshuflw_avx2(auVar37 ^ auVar13 ^ auVar30,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar24 = vpaddd_avx2(auVar13,auVar24);
  auVar37 = vpsrld_avx2(auVar29 ^ auVar24,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar24,0xc);
  auVar29 = vpor_avx2(auVar29,auVar37);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar30,auVar22);
  auVar24 = vpaddd_avx2(auVar37 ^ auVar13,auVar24);
  auVar27 = vpsrld_avx2(auVar29 ^ auVar24,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar24,7);
  auVar29 = vpor_avx2(auVar27,auVar29);
  auVar28 = vpaddd_avx2(auVar28,auVar35);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar28,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar14);
  auVar38 = vpsrld_avx2(auVar33 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar38);
  auVar28 = vpaddd_avx2(auVar35,auVar28);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar28,auVar22);
  auVar33 = vpaddd_avx2(auVar14 ^ auVar38,auVar33);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar23 = vpaddd_avx2(auVar23,auVar35);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar23,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar24 = vpaddd_avx2(auVar24,auVar12);
  auVar31 = vpsrld_avx2(auVar24 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar31);
  auVar23 = vpaddd_avx2(auVar35,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar23,auVar22);
  auVar24 = vpaddd_avx2(auVar24,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar24 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar21 = vpaddd_avx2(auVar21,auVar26);
  auVar13 = vpshuflw_avx2(auVar37 ^ auVar13 ^ auVar21,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar13);
  auVar37 = vpsrld_avx2(auVar33 ^ auVar26,0x14);
  auVar26 = vpslld_avx2(auVar33 ^ auVar26,0xc);
  auVar26 = vpor_avx2(auVar37,auVar26);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar21,auVar22);
  auVar33 = vpaddd_avx2(auVar37 ^ auVar13,auVar33);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar26,0x19);
  auVar26 = vpslld_avx2(auVar33 ^ auVar26,7);
  auVar26 = vpor_avx2(auVar26,auVar27);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar30,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar25 = vpaddd_avx2(auVar14,auVar25);
  auVar38 = vpsrld_avx2(auVar25 ^ auVar32,0x14);
  auVar32 = vpslld_avx2(auVar25 ^ auVar32,0xc);
  auVar32 = vpor_avx2(auVar32,auVar38);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar30,auVar22);
  auVar25 = vpaddd_avx2(auVar25,auVar14 ^ auVar38);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar25,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar25,7);
  auVar32 = vpor_avx2(auVar32,auVar27);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshuflw_avx2(auVar28 ^ (undefined1  [32])k[0xf],0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar20 = vpaddd_avx2(auVar27,auVar20);
  auVar34 = vpsrld_avx2(auVar29 ^ auVar20,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,0xc);
  auVar29 = vpor_avx2(auVar29,auVar34);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar28,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar34 ^ auVar27);
  auVar36 = vpsrld_avx2(auVar29 ^ auVar20,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,7);
  auVar29 = vpor_avx2(auVar29,auVar36);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshuflw_avx2(auVar23 ^ auVar34 ^ auVar27,0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar25 = vpaddd_avx2(auVar25,auVar27);
  auVar34 = vpsrld_avx2(auVar26 ^ auVar25,0x14);
  auVar26 = vpslld_avx2(auVar26 ^ auVar25,0xc);
  auVar26 = vpor_avx2(auVar26,auVar34);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar23,auVar22);
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar34 ^ auVar27);
  auVar25 = vpaddd_avx2(auVar25,auVar34 ^ auVar27);
  auVar27 = vpsrld_avx2(auVar26 ^ auVar25,0x19);
  auVar26 = vpslld_avx2(auVar26 ^ auVar25,7);
  auVar26 = vpor_avx2(auVar27,auVar26);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar21,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar20 = vpaddd_avx2(auVar20,auVar12);
  auVar31 = vpsrld_avx2(auVar32 ^ auVar20,0x14);
  auVar32 = vpslld_avx2(auVar32 ^ auVar20,0xc);
  auVar32 = vpor_avx2(auVar31,auVar32);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar21,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar20,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar20,7);
  auVar32 = vpor_avx2(auVar27,auVar32);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshuflw_avx2(auVar37 ^ auVar13 ^ auVar30,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar24 = vpaddd_avx2(auVar13,auVar24);
  auVar37 = vpsrld_avx2(auVar29 ^ auVar24,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar24,0xc);
  auVar29 = vpor_avx2(auVar29,auVar37);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar30,auVar22);
  auVar24 = vpaddd_avx2(auVar37 ^ auVar13,auVar24);
  auVar27 = vpsrld_avx2(auVar29 ^ auVar24,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar24,7);
  auVar29 = vpor_avx2(auVar27,auVar29);
  auVar28 = vpaddd_avx2(auVar28,auVar35);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar28,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar14);
  auVar38 = vpsrld_avx2(auVar33 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar38);
  auVar28 = vpaddd_avx2(auVar35,auVar28);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar28,auVar22);
  auVar33 = vpaddd_avx2(auVar14 ^ auVar38,auVar33);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar23 = vpaddd_avx2(auVar23,auVar35);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar23,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar24 = vpaddd_avx2(auVar24,auVar12);
  auVar31 = vpsrld_avx2(auVar24 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar31);
  auVar23 = vpaddd_avx2(auVar35,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar23,auVar22);
  auVar24 = vpaddd_avx2(auVar24,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar24 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar21 = vpaddd_avx2(auVar21,auVar26);
  auVar13 = vpshuflw_avx2(auVar37 ^ auVar13 ^ auVar21,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar13);
  auVar37 = vpsrld_avx2(auVar33 ^ auVar26,0x14);
  auVar26 = vpslld_avx2(auVar33 ^ auVar26,0xc);
  auVar26 = vpor_avx2(auVar26,auVar37);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar21,auVar22);
  auVar33 = vpaddd_avx2(auVar13 ^ auVar37,auVar33);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar26,0x19);
  auVar26 = vpslld_avx2(auVar33 ^ auVar26,7);
  auVar26 = vpor_avx2(auVar26,auVar27);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar30,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar25 = vpaddd_avx2(auVar14,auVar25);
  auVar38 = vpsrld_avx2(auVar32 ^ auVar25,0x14);
  auVar32 = vpslld_avx2(auVar32 ^ auVar25,0xc);
  auVar32 = vpor_avx2(auVar32,auVar38);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar30,auVar22);
  auVar25 = vpaddd_avx2(auVar14 ^ auVar38,auVar25);
  auVar27 = vpsrld_avx2(auVar32 ^ auVar25,0x19);
  auVar32 = vpslld_avx2(auVar32 ^ auVar25,7);
  auVar32 = vpor_avx2(auVar32,auVar27);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshuflw_avx2(auVar28 ^ (undefined1  [32])k[0xf],0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar20 = vpaddd_avx2(auVar27,auVar20);
  auVar34 = vpsrld_avx2(auVar29 ^ auVar20,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,0xc);
  auVar29 = vpor_avx2(auVar29,auVar34);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar28,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar34 ^ auVar27);
  auVar36 = vpsrld_avx2(auVar29 ^ auVar20,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,7);
  auVar29 = vpor_avx2(auVar29,auVar36);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshuflw_avx2(auVar23 ^ auVar34 ^ auVar27,0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar25 = vpaddd_avx2(auVar25,auVar27);
  auVar34 = vpsrld_avx2(auVar26 ^ auVar25,0x14);
  auVar26 = vpslld_avx2(auVar26 ^ auVar25,0xc);
  auVar26 = vpor_avx2(auVar26,auVar34);
  auVar23 = vpaddd_avx2(auVar26,auVar23);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar23,auVar22);
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar34 ^ auVar27);
  auVar25 = vpaddd_avx2(auVar25,auVar34 ^ auVar27);
  auVar27 = vpsrld_avx2(auVar26 ^ auVar25,0x19);
  auVar26 = vpslld_avx2(auVar26 ^ auVar25,7);
  auVar26 = vpor_avx2(auVar27,auVar26);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar21,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar20 = vpaddd_avx2(auVar20,auVar12);
  auVar31 = vpsrld_avx2(auVar20 ^ auVar32,0x14);
  auVar32 = vpslld_avx2(auVar20 ^ auVar32,0xc);
  auVar32 = vpor_avx2(auVar32,auVar31);
  auVar21 = vpaddd_avx2(auVar32,auVar21);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar21,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar12 ^ auVar31);
  auVar27 = vpsrld_avx2(auVar20 ^ auVar32,0x19);
  auVar32 = vpslld_avx2(auVar20 ^ auVar32,7);
  auVar32 = vpor_avx2(auVar32,auVar27);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshuflw_avx2(auVar13 ^ auVar37 ^ auVar30,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar24 = vpaddd_avx2(auVar13,auVar24);
  auVar37 = vpsrld_avx2(auVar24 ^ auVar29,0x14);
  auVar29 = vpslld_avx2(auVar24 ^ auVar29,0xc);
  auVar29 = vpor_avx2(auVar37,auVar29);
  auVar30 = vpaddd_avx2(auVar29,auVar30);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar30,auVar22);
  auVar24 = vpaddd_avx2(auVar24,auVar13 ^ auVar37);
  auVar27 = vpsrld_avx2(auVar29 ^ auVar24,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar24,7);
  auVar29 = vpor_avx2(auVar29,auVar27);
  auVar28 = vpaddd_avx2(auVar28,auVar35);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar28,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar33 = vpaddd_avx2(auVar14,auVar33);
  auVar38 = vpsrld_avx2(auVar33 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar35,auVar38);
  auVar28 = vpaddd_avx2(auVar28,auVar35);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar28,auVar22);
  auVar33 = vpaddd_avx2(auVar14 ^ auVar38,auVar33);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar33 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar23 = vpaddd_avx2(auVar23,auVar35);
  auVar12 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar23,0xb1);
  auVar12 = vpshufhw_avx2(auVar12,0xb1);
  auVar24 = vpaddd_avx2(auVar24,auVar12);
  auVar31 = vpsrld_avx2(auVar24 ^ auVar35,0x14);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,0xc);
  auVar35 = vpor_avx2(auVar31,auVar35);
  auVar23 = vpaddd_avx2(auVar35,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar22);
  auVar31 = vpshufb_avx2(auVar23,auVar22);
  auVar24 = vpaddd_avx2(auVar12 ^ auVar31,auVar24);
  auVar27 = vpsrld_avx2(auVar24 ^ auVar35,0x19);
  auVar35 = vpslld_avx2(auVar24 ^ auVar35,7);
  auVar35 = vpor_avx2(auVar35,auVar27);
  auVar21 = vpaddd_avx2(auVar21,auVar26);
  auVar13 = vpshuflw_avx2(auVar13 ^ auVar37 ^ auVar21,0xb1);
  auVar13 = vpshufhw_avx2(auVar13,0xb1);
  auVar33 = vpaddd_avx2(auVar33,auVar13);
  auVar37 = vpsrld_avx2(auVar33 ^ auVar26,0x14);
  auVar26 = vpslld_avx2(auVar33 ^ auVar26,0xc);
  auVar26 = vpor_avx2(auVar26,auVar37);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar13 = vpshufb_avx2(auVar13,auVar22);
  auVar37 = vpshufb_avx2(auVar21,auVar22);
  auVar33 = vpaddd_avx2(auVar13 ^ auVar37,auVar33);
  auVar27 = vpsrld_avx2(auVar33 ^ auVar26,0x19);
  auVar26 = vpslld_avx2(auVar33 ^ auVar26,7);
  auVar26 = vpor_avx2(auVar26,auVar27);
  auVar30 = vpaddd_avx2(auVar30,auVar32);
  auVar14 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar30,0xb1);
  auVar14 = vpshufhw_avx2(auVar14,0xb1);
  auVar25 = vpaddd_avx2(auVar14,auVar25);
  auVar38 = vpsrld_avx2(auVar25 ^ auVar32,0x14);
  auVar32 = vpslld_avx2(auVar25 ^ auVar32,0xc);
  auVar32 = vpor_avx2(auVar32,auVar38);
  auVar30 = vpaddd_avx2(auVar32,auVar30);
  auVar14 = vpshufb_avx2(auVar14,auVar22);
  auVar38 = vpshufb_avx2(auVar30,auVar22);
  auVar25 = vpaddd_avx2(auVar25,auVar14 ^ auVar38);
  auVar27 = vpsrld_avx2(auVar25 ^ auVar32,0x19);
  auVar32 = vpslld_avx2(auVar25 ^ auVar32,7);
  auVar32 = vpor_avx2(auVar32,auVar27);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshuflw_avx2(auVar28 ^ (undefined1  [32])k[0xf],0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar20 = vpaddd_avx2(auVar27,auVar20);
  auVar34 = vpsrld_avx2(auVar29 ^ auVar20,0x14);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,0xc);
  auVar29 = vpor_avx2(auVar29,auVar34);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  auVar27 = vpshufb_avx2(auVar27,auVar22);
  auVar34 = vpshufb_avx2(auVar28,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar27 ^ auVar34);
  auVar36 = vpsrld_avx2(auVar29 ^ auVar20,0x19);
  auVar29 = vpslld_avx2(auVar29 ^ auVar20,7);
  auVar29 = vpor_avx2(auVar36,auVar29);
  auVar23 = vpaddd_avx2(auVar23,auVar26);
  auVar27 = vpshuflw_avx2(auVar27 ^ auVar34 ^ auVar23,0xb1);
  auVar27 = vpshufhw_avx2(auVar27,0xb1);
  auVar25 = vpaddd_avx2(auVar25,auVar27);
  auVar34 = vpsrld_avx2(auVar25 ^ auVar26,0x14);
  auVar26 = vpslld_avx2(auVar25 ^ auVar26,0xc);
  auVar26 = vpor_avx2(auVar34,auVar26);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar26,auVar23);
  auVar23 = vpshufb_avx2(auVar27,auVar22);
  auVar27 = vpshufb_avx2((undefined1  [32])alVar1,auVar22);
  *k = alVar1;
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar27 ^ auVar23);
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar25,auVar27 ^ auVar23);
  k[10] = alVar2;
  auVar25 = vpsrld_avx2((undefined1  [32])alVar2 ^ auVar26,0x19);
  auVar23 = vpslld_avx2((undefined1  [32])alVar2 ^ auVar26,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar23,auVar25);
  auVar23 = vpaddd_avx2(auVar32,auVar21);
  auVar21 = vpshuflw_avx2(auVar12 ^ auVar31 ^ auVar23,0xb1);
  auVar26 = vpshufhw_avx2(auVar21,0xb1);
  auVar21 = vpaddd_avx2(auVar20,auVar26);
  auVar20 = vpsrld_avx2(auVar32 ^ auVar21,0x14);
  auVar25 = vpslld_avx2(auVar32 ^ auVar21,0xc);
  auVar25 = vpor_avx2(auVar25,auVar20);
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar25,auVar23);
  auVar23 = vpshufb_avx2(auVar26,auVar22);
  auVar20 = vpshufb_avx2((undefined1  [32])alVar2,auVar22);
  alVar15 = (Lib_IntVector_Intrinsics_vec256)(auVar23 ^ auVar20);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar15,auVar21);
  auVar21 = vpsrld_avx2((undefined1  [32])alVar3 ^ auVar25,0x19);
  auVar23 = vpslld_avx2((undefined1  [32])alVar3 ^ auVar25,7);
  alVar9 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar23,auVar21);
  auVar23 = vpaddd_avx2(auVar29,auVar30);
  auVar21 = vpshuflw_avx2(auVar13 ^ auVar37 ^ auVar23,0xb1);
  auVar30 = vpshufhw_avx2(auVar21,0xb1);
  auVar24 = vpaddd_avx2(auVar24,auVar30);
  auVar25 = vpsrld_avx2(auVar29 ^ auVar24,0x14);
  auVar21 = vpslld_avx2(auVar29 ^ auVar24,0xc);
  auVar21 = vpor_avx2(auVar25,auVar21);
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar21,auVar23);
  auVar23 = vpshufb_avx2(auVar30,auVar22);
  auVar30 = vpshufb_avx2((undefined1  [32])alVar4,auVar22);
  alVar16 = (Lib_IntVector_Intrinsics_vec256)(auVar23 ^ auVar30);
  alVar5 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar24,(undefined1  [32])alVar16);
  auVar23 = vpsrld_avx2(auVar21 ^ (undefined1  [32])alVar5,0x19);
  auVar24 = vpslld_avx2(auVar21 ^ (undefined1  [32])alVar5,7);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar24,auVar23);
  auVar24 = vpaddd_avx2(auVar28,auVar35);
  auVar23 = vpshuflw_avx2(auVar14 ^ auVar38 ^ auVar24,0xb1);
  auVar30 = vpshufhw_avx2(auVar23,0xb1);
  auVar23 = vpaddd_avx2(auVar30,auVar33);
  auVar33 = vpsrld_avx2(auVar35 ^ auVar23,0x14);
  auVar21 = vpslld_avx2(auVar35 ^ auVar23,0xc);
  auVar21 = vpor_avx2(auVar33,auVar21);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar21,auVar24);
  auVar24 = vpshufb_avx2(auVar30,auVar22);
  auVar33 = vpshufb_avx2((undefined1  [32])alVar6,auVar22);
  alVar17 = (Lib_IntVector_Intrinsics_vec256)(auVar24 ^ auVar33);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar23,(undefined1  [32])alVar17);
  auVar23 = vpsrld_avx2((undefined1  [32])alVar7 ^ auVar21,0x19);
  auVar24 = vpslld_avx2((undefined1  [32])alVar7 ^ auVar21,7);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar24,auVar23);
  k[5] = alVar8;
  k[1] = alVar2;
  k[0xc] = alVar15;
  k[0xb] = alVar3;
  k[6] = alVar9;
  k[2] = alVar4;
  k[0xd] = alVar16;
  k[8] = alVar5;
  k[7] = alVar10;
  k[3] = alVar6;
  k[0xe] = alVar17;
  k[9] = alVar7;
  k[4] = alVar11;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])*ctx);
  *k = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar2,(undefined1  [32])ctx[1]);
  k[1] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar4,(undefined1  [32])ctx[2]);
  k[2] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar6,(undefined1  [32])ctx[3]);
  k[3] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])ctx[4]);
  k[4] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])ctx[5]);
  k[5] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])ctx[6]);
  k[6] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])ctx[7]);
  k[7] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])ctx[8]);
  k[8] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar7,(undefined1  [32])ctx[9]);
  k[9] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[10],(undefined1  [32])k[10]);
  k[10] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar3,(undefined1  [32])ctx[0xb]);
  k[0xb] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar15,(undefined1  [32])ctx[0xc]);
  k[0xc] = alVar1;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar16,(undefined1  [32])ctx[0xd]);
  k[0xd] = alVar2;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar17,(undefined1  [32])ctx[0xe]);
  k[0xe] = alVar2;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[0xf],(undefined1  [32])k[0xf]);
  k[0xf] = alVar2;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar1,auVar19);
  k[0xc] = alVar1;
  return;
}

Assistant:

static inline void
chacha20_core_256(
  Lib_IntVector_Intrinsics_vec256 *k,
  Lib_IntVector_Intrinsics_vec256 *ctx,
  uint32_t ctr
)
{
  memcpy(k, ctx, 16U * sizeof (Lib_IntVector_Intrinsics_vec256));
  uint32_t ctr_u32 = 8U * ctr;
  Lib_IntVector_Intrinsics_vec256 cv = Lib_IntVector_Intrinsics_vec256_load32(ctr_u32);
  k[12U] = Lib_IntVector_Intrinsics_vec256_add32(k[12U], cv);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    Lib_IntVector_Intrinsics_vec256 *os = k;
    Lib_IntVector_Intrinsics_vec256 x = Lib_IntVector_Intrinsics_vec256_add32(k[i], ctx[i]);
    os[i] = x;);
  k[12U] = Lib_IntVector_Intrinsics_vec256_add32(k[12U], cv);
}